

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbutton.cpp
# Opt level: O2

bool __thiscall QToolButton::event(QToolButton *this,QEvent *event)

{
  QToolButtonPrivate *this_00;
  bool bVar1;
  QHoverEvent *he;
  long in_FS_OFFSET;
  QPointF local_38;
  QPoint local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(ushort *)(event + 8) - 0x7f < 3) {
    this_00 = *(QToolButtonPrivate **)&(this->super_QAbstractButton).super_QWidget.field_0x8;
    local_38 = QSinglePointEvent::position((QSinglePointEvent *)event);
    local_28 = QPointF::toPoint(&local_38);
    QToolButtonPrivate::updateHoverControl(this_00,&local_28);
  }
  bVar1 = QAbstractButton::event(&this->super_QAbstractButton,event);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QToolButton::event(QEvent *event)
{
    switch(event->type()) {
    case QEvent::HoverEnter:
    case QEvent::HoverLeave:
    case QEvent::HoverMove:
        if (const QHoverEvent *he = static_cast<const QHoverEvent *>(event))
            d_func()->updateHoverControl(he->position().toPoint());
        break;
    default:
        break;
    }
    return QAbstractButton::event(event);
}